

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O1

MemChunk * __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
arenaAlloc(MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
           *this,size_type chunkSize)

{
  SmallMemChunk *chunk;
  SmallMemChunk *pSVar1;
  SmallMemChunk *pSVar2;
  SmallMemChunk *curr;
  MemSegment *pMVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  size_type *psVar7;
  size_type segSize;
  size_type local_20;
  
  local_20 = chunkSize + 0x18;
  if ((0xffffffffffffffe7 < chunkSize) ||
     (((this->m_footprintLimit != 0 &&
       (uVar5 = this->m_footprint + local_20,
       this->m_footprintLimit < uVar5 || uVar5 <= this->m_footprint)) ||
      (pMVar3 = (MemSegment *)CachedArena<cookmem::MallocArena>::getSegment(this->m_arena,&local_20)
      , pMVar3 == (MemSegment *)0x0)))) {
    return (MemChunk *)0x0;
  }
  uVar5 = this->m_footprint + local_20;
  this->m_footprint = uVar5;
  if (this->m_maxFootprint < uVar5) {
    this->m_maxFootprint = uVar5;
  }
  pMVar3->m_size = local_20;
  pMVar3->m_pad = 1;
  pMVar3[1].m_size = local_20 - 0x18;
  *(size_type *)((long)pMVar3 + (local_20 - 8)) = local_20 - 0x18;
  if (this->m_segList == (MemSegment *)0x0) {
    this->m_segList = pMVar3;
    pMVar3->m_next = (MemSegment *)0x0;
    this->m_release_checks = 0xfff;
  }
  else {
    pMVar3->m_next = this->m_segList;
    this->m_segList = pMVar3;
  }
  psVar7 = &pMVar3->m_pad;
  uVar6 = pMVar3[1].m_size & 0xfffffffffffffff0;
  uVar5 = uVar6 - chunkSize;
  if (uVar5 < 0x20) {
    return (MemChunk *)psVar7;
  }
  chunk = (SmallMemChunk *)((long)psVar7 + chunkSize);
  pMVar3[1].m_size = chunkSize;
  *(size_type *)((long)&pMVar3->m_pad + chunkSize) = chunkSize;
  *(ulong *)((long)&pMVar3[1].m_size + chunkSize) = uVar5;
  *(ulong *)((long)&pMVar3->m_pad + uVar6) = uVar5;
  if (0xff < uVar5) {
    addLargeChunk(this,(MemChunk *)chunk);
    return (MemChunk *)psVar7;
  }
  uVar4 = (uint)(uVar5 >> 3) & 0x1e;
  pSVar1 = this->m_smallLists[uVar4].m_head;
  if (pSVar1 == (SmallMemChunk *)0x0) {
    chunk->next = chunk;
    chunk->prev = chunk;
    this->m_smallLists[uVar4].m_head = chunk;
  }
  else {
    pSVar2 = pSVar1->next;
    pSVar1->next = chunk;
    pSVar2->prev = chunk;
    chunk->next = pSVar2;
    chunk->prev = pSVar1;
  }
  if ((this->m_smallMap >> uVar4 & 1) != 0) {
    return (MemChunk *)psVar7;
  }
  this->m_smallMap = this->m_smallMap | 1 << (sbyte)uVar4;
  return (MemChunk *)psVar7;
}

Assistant:

MemChunk*
    arenaAlloc (size_type chunkSize)
    {
        size_type estSize;             /* allocation size */

        estSize = chunkSize + SEGMENT_OVERHEAD;
        if (estSize <= chunkSize)
        {
            // Technically can never reach here due to the MAX_REQUEST value
            //
            // However it is always good to have a check.
            return nullptr;
        }

        /*
         * Check user specified foot print limit
         */
        if (m_footprintLimit != 0)
        {
            size_type fp = m_footprint + estSize;
            if (fp <= m_footprint || fp > m_footprintLimit)
            {
                return nullptr;
            }
        }

        /*
         * Request memory segments from arena.
         */
        size_type segSize = estSize;
        MemSegment* seg = (MemSegment*)m_arena.getSegment (segSize);
        m_logger.logGetSegment (seg, segSize);

        /*
         * Initialize the segment obtained.
         */
        if (seg)
        {

            if ((m_footprint += segSize) > m_maxFootprint)
            {
                m_maxFootprint = m_footprint;
            }

            MemChunk* chunk = seg->init (segSize);

            if (m_segList == nullptr)
            {
                m_segList = seg;
                seg->setNext (nullptr);

                m_release_checks = MAX_RELEASE_CHECK_RATE;
            }
            else
            {
                seg->setNext (m_segList);
                m_segList = seg;
            }

            return splitChunk (chunk, chunkSize);
        }
        return nullptr;
    }